

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

ssize_t __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_>::write
          (basic_writer<duckdb_fmt::v6::buffer_range<wchar_t>_> *this,int __fd,void *__buf,
          size_t __n)

{
  checked_ptr<typename_buffer<wchar_t>::value_type> __result;
  wchar_t *pwVar1;
  undefined4 in_register_00000034;
  
  __result = reserve<duckdb_fmt::v6::internal::buffer<wchar_t>,_0>(&this->out_,(size_t)__buf);
  pwVar1 = std::__copy_move<false,false,std::random_access_iterator_tag>::
           __copy_m<char_const*,wchar_t*>
                     ((char *)CONCAT44(in_register_00000034,__fd),
                      (char *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd)),__result);
  return (ssize_t)pwVar1;
}

Assistant:

void write(string_view value) {
    auto&& it = reserve(value.size());
    it = copy_str<char_type>(value.begin(), value.end(), it);
  }